

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O0

WarningState warningState(WarningID id)

{
  WarningState local_14;
  WarningState state;
  WarningID id_local;
  
  if (warnings) {
    local_14 = warningStates[id];
    if (local_14 == WARNING_DEFAULT) {
      local_14 = defaultWarnings[id];
    }
    if ((warningsAreErrors) && (local_14 == WARNING_ENABLED)) {
      local_14 = WARNING_ERROR;
    }
    state = local_14;
  }
  else {
    state = WARNING_DISABLED;
  }
  return state;
}

Assistant:

static enum WarningState warningState(enum WarningID id)
{
	// Check if warnings are globally disabled
	if (!warnings)
		return WARNING_DISABLED;

	// Get the actual state
	enum WarningState state = warningStates[id];

	if (state == WARNING_DEFAULT)
		// The state isn't set, grab its default state
		state = defaultWarnings[id];

	if (warningsAreErrors && state == WARNING_ENABLED)
		state = WARNING_ERROR;

	return state;
}